

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mymock.hpp
# Opt level: O0

void __thiscall MyMock::~MyMock(MyMock *this)

{
  MyMock *this_local;
  
  ~MyMock(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

MyMock()
  {
    MOCKARON_DECLARE_IMPL(My, f);
    MOCKARON_DECLARE_IMPL_SIG(int(int const&), My, g);
    MOCKARON_DECLARE_IMPL_SIG(float(float), My, g);
    MOCKARON_DECLARE_IMPL(My, h);
    MOCKARON_DECLARE_IMPL(My, i);
    MOCKARON_DECLARE_IMPL(My, j);
    MOCKARON_DECLARE_IMPL(My, k);
  }